

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nhdp_1.c
# Opt level: O0

void addAddresses(rfc5444_writer *wr)

{
  int iVar1;
  undefined1 local_32;
  undefined1 local_31;
  char value1;
  undefined8 uStack_30;
  char value0;
  rfc5444_writer_address *addr;
  netaddr ip;
  rfc5444_writer *wr_local;
  
  local_31 = 0;
  local_32 = 1;
  ip._10_8_ = wr;
  iVar1 = netaddr_from_string((long)&addr + 6,"10.1.0.101");
  cunit_named_check(iVar1 == 0,"addAddresses",0x9f,"failed to initialize ip");
  uStack_30 = rfc5444_writer_add_address(ip._10_8_,cpr.creator,(long)&addr + 6,0);
  rfc5444_writer_add_addrtlv(ip._10_8_,uStack_30,0x1043a8,&local_32,1,0);
  iVar1 = netaddr_from_string((long)&addr + 6,"10.1.0.102");
  cunit_named_check(iVar1 == 0,"addAddresses",0xa4,"failed to initialize ip");
  uStack_30 = rfc5444_writer_add_address(ip._10_8_,cpr.creator,(long)&addr + 6,0);
  rfc5444_writer_add_addrtlv(ip._10_8_,uStack_30,addrtlvs,&local_31,1,0);
  iVar1 = netaddr_from_string((long)&addr + 6,"10.1.0.103");
  cunit_named_check(iVar1 == 0,"addAddresses",0xa9,"failed to initialize ip");
  uStack_30 = rfc5444_writer_add_address(ip._10_8_,cpr.creator,(long)&addr + 6,0);
  rfc5444_writer_add_addrtlv(ip._10_8_,uStack_30,0x1043a8,&local_32,1,0);
  iVar1 = netaddr_from_string((long)&addr + 6,"10.11.11.11");
  cunit_named_check(iVar1 == 0,"addAddresses",0xae,"failed to initialize ip");
  uStack_30 = rfc5444_writer_add_address(ip._10_8_,cpr.creator,(long)&addr + 6,0);
  rfc5444_writer_add_addrtlv(ip._10_8_,uStack_30,0x1043a8,&local_32,1,0);
  return;
}

Assistant:

static void addAddresses(struct rfc5444_writer *wr) {
  struct netaddr ip; // = { { 10,1,0,101}, AF_INET, 32 };
  struct rfc5444_writer_address *addr;
  char value0 =  0, value1 = 1;

  CHECK_TRUE(0 == netaddr_from_string(&ip, "10.1.0.101"), "failed to initialize ip");
  //ip._addr[0] = 10; ip._addr[1] = 1; ip._addr[2] = 0; ip._addr[3] = 101;
  addr = rfc5444_writer_add_address(wr, cpr.creator, &ip, false);
  rfc5444_writer_add_addrtlv(wr, addr, &addrtlvs[1], &value1, 1, false);

  CHECK_TRUE(0 == netaddr_from_string(&ip, "10.1.0.102"), "failed to initialize ip");
  //ip._addr[0] = 10; ip._addr[1] = 1; ip._addr[2] = 0; ip._addr[3] = 102;
  addr = rfc5444_writer_add_address(wr, cpr.creator, &ip, false);
  rfc5444_writer_add_addrtlv(wr, addr, &addrtlvs[0], &value0, 1, false);

  CHECK_TRUE(0 == netaddr_from_string(&ip, "10.1.0.103"), "failed to initialize ip");
  //ip._addr[0] = 10; ip._addr[1] = 1; ip._addr[2] = 0; ip._addr[3] = 103;
  addr = rfc5444_writer_add_address(wr, cpr.creator, &ip, false);
  rfc5444_writer_add_addrtlv(wr, addr, &addrtlvs[1], &value1, 1, false);

  CHECK_TRUE(0 == netaddr_from_string(&ip, "10.11.11.11"), "failed to initialize ip");
  //ip._addr[0] = 10; ip._addr[1] = 11; ip._addr[2] = 11; ip._addr[3] = 11;
  addr = rfc5444_writer_add_address(wr, cpr.creator, &ip, false);
  rfc5444_writer_add_addrtlv(wr, addr, &addrtlvs[1], &value1, 1, false);
}